

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot_i.hpp
# Opt level: O1

Gnuplot * __thiscall
Gnuplot::plotfile_xy(Gnuplot *this,string *filename,uint column_x,uint column_y,string *title)

{
  byte bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  ostringstream local_1d0 [8];
  ostringstream cmdstr;
  ios_base local_160 [264];
  string local_58;
  uint local_34;
  
  local_34 = column_y;
  file_available(this,filename);
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  bVar1 = 0 < this->nplots & this->two_dim;
  pcVar4 = "plot ";
  if (bVar1 != 0) {
    pcVar4 = "replot ";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1d0,pcVar4,(ulong)bVar1 * 2 + 5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"\"",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(filename->_M_dataplus)._M_p,filename->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" using ",8);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0," title \"",8);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1d0,(title->_M_dataplus)._M_p,title->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\" ",2);
  iVar2 = std::__cxx11::string::compare((char *)&this->smooth);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1d0,"with ",5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1d0,(this->pstyle)._M_dataplus._M_p,(this->pstyle)._M_string_length)
    ;
  }
  std::__cxx11::stringbuf::str();
  cmd(this,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  std::ios_base::~ios_base(local_160);
  return this;
}

Assistant:

Gnuplot& Gnuplot::plotfile_xy(const std::string &filename,
                              const unsigned int column_x,
                              const unsigned int column_y,
                              const std::string &title) {
  //
  // check if file exists
  //
  file_available(filename);

  std::ostringstream cmdstr;
  //
  // command to be sent to gnuplot
  //
  if (nplots > 0 && two_dim == true)
    cmdstr << "replot ";
  else
    cmdstr << "plot ";

  cmdstr << "\"" << filename << "\" using " << column_x << ":" << column_y;

//  if (title == "")
//   cmdstr << " notitle ";
//  else
  cmdstr << " title \"" << title << "\" ";

  if (smooth == "")
    cmdstr << "with " << pstyle;
//  else
//   cmdstr << "smooth " << smooth;

  //
  // Do the actual plot
  //
  cmd(cmdstr.str());
  return *this;
}